

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQInteger sq_getsize(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType type_00;
  SQObjectPtr *pSVar1;
  SQObjectType type;
  SQObjectPtr *o;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  pSVar1 = stack_get(v,idx);
  type_00 = (pSVar1->super_SQObject)._type;
  if (type_00 == OT_STRING) {
    v_local = (HSQUIRRELVM)
              (((pSVar1->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              _sharedstate;
  }
  else if (type_00 == OT_ARRAY) {
    v_local = (HSQUIRRELVM)SQArray::Size((pSVar1->super_SQObject)._unVal.pArray);
  }
  else if (type_00 == OT_CLASS) {
    v_local = (HSQUIRRELVM)((pSVar1->super_SQObject)._unVal.pClass)->_udsize;
  }
  else if (type_00 == OT_TABLE) {
    v_local = (HSQUIRRELVM)SQTable::CountUsed((pSVar1->super_SQObject)._unVal.pTable);
  }
  else if (type_00 == OT_USERDATA) {
    v_local = (HSQUIRRELVM)((pSVar1->super_SQObject)._unVal.pTable)->_firstfree;
  }
  else if (type_00 == OT_INSTANCE) {
    v_local = (HSQUIRRELVM)((pSVar1->super_SQObject)._unVal.pClass)->_base->_udsize;
  }
  else {
    v_local = (HSQUIRRELVM)sq_aux_invalidtype(v,type_00);
  }
  return (SQInteger)v_local;
}

Assistant:

SQInteger sq_getsize(HSQUIRRELVM v, SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    SQObjectType type = type(o);
    switch(type) {
    case OT_STRING:     return _string(o)->_len;
    case OT_TABLE:      return _table(o)->CountUsed();
    case OT_ARRAY:      return _array(o)->Size();
    case OT_USERDATA:   return _userdata(o)->_size;
    case OT_INSTANCE:   return _instance(o)->_class->_udsize;
    case OT_CLASS:      return _class(o)->_udsize;
    default:
        return sq_aux_invalidtype(v, type);
    }
}